

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool ON_GetViewportRotationAngles
               (ON_3dVector *X,ON_3dVector *Y,ON_3dVector *Z,double *angle1,double *angle2,
               double *angle3)

{
  bool bVar1;
  bool bVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  double __x;
  double dVar3;
  double dVar4;
  double cos_a3;
  double sin_a3;
  double cos_a2;
  double sin_a2;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  double local_40;
  double local_38;
  
  bVar2 = false;
  local_38 = 0.0;
  local_40 = 1.0;
  local_70 = 0.0;
  local_78 = 1.0;
  local_80 = 0.0;
  local_88 = 1.0;
  dVar3 = ON_3dVector::operator*(X,X);
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._0_8_ = dVar3;
  local_58._12_4_ = extraout_XMM0_Dd;
  dVar3 = ON_3dVector::operator*(Y,Y);
  local_68._8_4_ = extraout_XMM0_Dc_00;
  local_68._0_8_ = dVar3;
  local_68._12_4_ = extraout_XMM0_Dd_00;
  dVar3 = ON_3dVector::operator*(Z,Z);
  dVar4 = 0.0;
  __x = 1.0;
  if (1.192092895508e-07 < ABS((double)local_58._0_8_ + -1.0)) goto LAB_006642ff;
  if ((1.192092895508e-07 < ABS((double)local_68._0_8_ + -1.0)) ||
     (1.192092895508e-07 < ABS(dVar3 + -1.0))) {
    bVar2 = false;
    goto LAB_006642ff;
  }
  dVar3 = ON_3dVector::operator*(X,Y);
  local_58._8_4_ = extraout_XMM0_Dc_01;
  local_58._0_8_ = dVar3;
  local_58._12_4_ = extraout_XMM0_Dd_01;
  dVar3 = ON_3dVector::operator*(Y,Z);
  local_68._8_4_ = extraout_XMM0_Dc_02;
  local_68._0_8_ = dVar3;
  local_68._12_4_ = extraout_XMM0_Dd_02;
  dVar3 = ON_3dVector::operator*(Z,X);
  bVar1 = false;
  if (1.192092895508e-07 < ABS((double)local_58._0_8_)) {
    __x = 1.0;
LAB_00664573:
    dVar4 = 0.0;
    bVar2 = bVar1;
  }
  else {
    if (((1.192092895508e-07 < ABS((double)local_68._0_8_)) || (1.192092895508e-07 < ABS(dVar3))) ||
       (dVar3 = ON_TripleProduct(X,Y,Z), dVar3 <= 0.0)) {
      bVar2 = false;
    }
    else {
      local_78 = Z->z;
      local_58._0_8_ = Z->x;
      local_58._8_8_ = Z->y;
      dVar3 = ABS(Z->x);
      dVar4 = ABS(Z->y);
      if (dVar3 <= dVar4) {
        local_70 = 0.0;
        if (dVar3 < dVar4) {
          local_70 = SQRT((dVar3 / dVar4) * (dVar3 / dVar4) + 1.0) * dVar4;
        }
      }
      else {
        local_70 = SQRT((dVar4 / dVar3) * (dVar4 / dVar3) + 1.0) * dVar3;
      }
      unitize2d(local_78,local_70,&local_78,&local_70);
      if (0.0 < local_70) {
        local_68._8_8_ = 0;
        local_68._0_8_ = local_70;
        local_38 = X->z;
        local_40 = Y->z;
        unitize2d(local_40,local_38,&local_40,&local_38);
        local_88 = -(double)local_58._8_8_;
        local_80 = (double)local_58._0_8_;
        unitize2d(local_88,(double)local_58._0_8_,&local_88,&local_80);
        bVar2 = true;
        bVar1 = true;
        dVar4 = local_38;
        __x = local_40;
        if (((local_40 != -1.0) || (NAN(local_40))) ||
           ((bVar2 = true, local_38 != 0.0 || (NAN(local_38))))) goto LAB_006642ff;
        local_70 = -(double)local_68._0_8_;
        local_80 = -local_80;
        local_88 = -local_88;
        __x = 0.0;
        goto LAB_00664573;
      }
      if ((local_78 != 1.0) || (NAN(local_78))) {
        dVar4 = 0.0;
        bVar2 = true;
        __x = 1.0;
        if ((local_78 == -1.0) && (!NAN(local_78))) {
          local_88 = -Y->y;
          local_80 = Y->x;
        }
        goto LAB_006642ff;
      }
      local_88 = Y->y;
      local_80 = -Y->x;
      bVar2 = true;
    }
    dVar4 = 0.0;
    __x = 1.0;
  }
LAB_006642ff:
  if (angle1 != (double *)0x0) {
    dVar3 = atan2(dVar4,__x);
    *angle1 = dVar3;
  }
  if (angle2 != (double *)0x0) {
    dVar3 = atan2(local_70,local_78);
    *angle2 = dVar3;
  }
  if (angle3 != (double *)0x0) {
    dVar3 = atan2(local_80,local_88);
    *angle3 = dVar3;
  }
  return bVar2;
}

Assistant:

bool 
ON_GetViewportRotationAngles( 
    const ON_3dVector& X, // X,Y,Z must be a right handed orthonormal basis
    const ON_3dVector& Y, 
    const ON_3dVector& Z,
    double* angle1, // returns rotation about world Z
    double* angle2, // returns rotation about world X ( 0 <= a2 <= pi )
    double* angle3  // returns rotation about world Z
    )
{
  // double a1 = 0.0;  // rotation about world Z
  // double a2 = 0.0;  // rotation about world X ( 0 <= a2 <= pi )
  // double a3 = 0.0;  // rotation about world Z
  bool bValidFrame = false;
  double sin_a1 = 0.0;
  double cos_a1 = 1.0;
  double sin_a2 = 0.0;
  double cos_a2 = 1.0;
  double sin_a3 = 0.0;
  double cos_a3 = 1.0;

  // If si = sin(ai) and ci = cos(ai), then the relationship between the camera
  // frame and the angles is defined by the matrix equation C = R3*R2*R1, where:
  //
  //      c1 -s1  0        1   0   0         c3 -s3  0
  // R1 = s1  c1  0  R2 =  0  c2 -s2   R3 =  s3  c3  0
  //       0   0  1        0  s2  c2          0   0  1
  //
  //     CamX[0]  CamY[0] CamZ[0]
  // C = CamX[1]  CamY[1] CamZ[1]
  //     CamX[2]  CamY[2] CamZ[2]
  //
  //              .       .     s2*s3
  //
  // R3*R2*R1 =   .       .    -s2*c3
  //
  //            s1*s2   c1*s2    c2
  //

  {
    // don't attempt to work with slop
    const double eps = 8.0*ON_SQRT_EPSILON;
    double dx,dy,dz,d;
    dx = X*X;
    dy = Y*Y;
    dz = Z*Z;
    if ( fabs(dx-1.0) <= eps && fabs(dy-1.0) <= eps && fabs(dz-1.0) <= eps ) {
      dx = X*Y;
      dy = Y*Z;
      dz = Z*X;
      if ( fabs(dx) <= eps && fabs(dy) <= eps && fabs(dz) <= eps ) {
        d = ON_TripleProduct( X, Y, Z );
        bValidFrame = (d > 0.0);
      }
    }
  }

  if ( bValidFrame ) 
  {
    // Usually "Z" = opposite of unitized camera direction.
    //         "Y" = camera up made ortho to "Z" and unitized.
    //         "X" = YxZ.
    // So, when possible, I solve for angles in terms
    // of "Z" and "Y" since "X" will generally have the most noise.
    //         
    // Use C = R3*R2*R1 to get sin(a2), cos(a2).
    cos_a2 = Z.z;
    sin_a2 = len2d(Z.x,Z.y);
    unitize2d(cos_a2,sin_a2,&cos_a2,&sin_a2); // kill noise

    if ( sin_a2 > 0.0 ) {
      // use bottom row to get angle1.
      sin_a1 = X.z;
      cos_a1 = Y.z;
      unitize2d(cos_a1,sin_a1,&cos_a1,&sin_a1); // kill noise

      // use right column to get angle3
      cos_a3 = -Z.y;
      sin_a3 =  Z.x;
      unitize2d(cos_a3,sin_a3,&cos_a3,&sin_a3); // kill noise
    }
    else if ( cos_a2 == 1.0 ) {
      // R2 = identity and C determines (angle1+angle3)
      //      arbitrarily set angle1 = 0.
      cos_a3 =  Y.y; // = cos(angle3+angle1)
      sin_a3 = -Y.x; // = sin(angle3+angle1)
    }
    else if ( cos_a2 == -1.0 ) {
      // R2 = [1 0 0 / 0 -1 0/ 0 0 -1] and C determines (angle3-angle1)
      //      arbitrarily set angle1 = 0
      cos_a3 = -Y.y; // = cos(angle3-angle1)
      sin_a3 =  Y.x; // = sin(angle3-angle1)
    }
  }


  if ( cos_a1 == -1.0 && sin_a1 == 0.0 ) {
    // when a1 = pi, juggle angles to get a1 = 0 with
    // same effective rotation to keep legacy 3d apps
    // happy.
    // a1: pi -> 0
    // a2: a2 -> 2pi - a2
    // a1: a3 ->  pi + a3
    sin_a1 = 0.0;
    cos_a1 = 0.0;
    sin_a2 = -sin_a2;
    sin_a3 = -sin_a3;
    cos_a3 = -cos_a3;
  }
  
  if ( angle1 )
    *angle1 = atan2( sin_a1, cos_a1 );
  if ( angle2 )
    *angle2 = atan2( sin_a2, cos_a2 );
  if ( angle3 )
    *angle3 = atan2( sin_a3, cos_a3 );

  return bValidFrame;
}